

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O1

void unlockPointer(_GLFWwindow *window)

{
  wl_proxy *pwVar1;
  PFN_wl_proxy_marshal_flags p_Var2;
  uint32_t uVar3;
  
  p_Var2 = _glfw.wl.client.proxy_marshal_flags;
  pwVar1 = (wl_proxy *)(window->wl).relativePointer;
  uVar3 = (*_glfw.wl.client.proxy_get_version)(pwVar1);
  (*p_Var2)(pwVar1,0,(wl_interface *)0x0,uVar3,1);
  (window->wl).relativePointer = (zwp_relative_pointer_v1 *)0x0;
  p_Var2 = _glfw.wl.client.proxy_marshal_flags;
  pwVar1 = (wl_proxy *)(window->wl).lockedPointer;
  uVar3 = (*_glfw.wl.client.proxy_get_version)(pwVar1);
  (*p_Var2)(pwVar1,0,(wl_interface *)0x0,uVar3,1);
  (window->wl).lockedPointer = (zwp_locked_pointer_v1 *)0x0;
  return;
}

Assistant:

static void unlockPointer(_GLFWwindow* window)
{
    zwp_relative_pointer_v1_destroy(window->wl.relativePointer);
    window->wl.relativePointer = NULL;

    zwp_locked_pointer_v1_destroy(window->wl.lockedPointer);
    window->wl.lockedPointer = NULL;
}